

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O1

void __thiscall
btMultiBody::stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
          (anon_struct_1_0_00000001 *this,btVector3 *omega,btQuaternion *quat,bool baseBody,
          btScalar dt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btScalar bVar12;
  btScalar bVar13;
  btScalar bVar14;
  btScalar bVar15;
  float fVar16;
  float fVar17;
  
  if ((int)quat == 0) {
    fVar8 = omega->m_floats[3];
    fVar2 = *(float *)(this + 8);
    fVar3 = omega->m_floats[0];
    fVar16 = (float)*(undefined8 *)(omega->m_floats + 1);
    fVar17 = (float)((ulong)*(undefined8 *)(omega->m_floats + 1) >> 0x20);
    fVar6 = (float)*(undefined8 *)this;
    fVar7 = (float)((ulong)*(undefined8 *)this >> 0x20);
    fVar5 = (fVar8 * fVar7 + fVar17 * fVar6) - fVar3 * fVar2;
    fVar10 = (fVar2 * fVar8 + fVar3 * (float)*(undefined8 *)(this + 4)) - fVar16 * fVar6;
    fVar11 = (fVar6 * fVar8 + fVar16 * (float)((ulong)*(undefined8 *)(this + 4) >> 0x20)) -
             fVar17 * fVar7;
    fVar4 = -fVar16;
    fVar9 = -fVar17;
    fVar2 = fVar2 * fVar9 + (fVar7 * fVar4 - fVar6 * fVar3);
    fVar6 = fVar16 * fVar10 + fVar9 * fVar5 + -fVar3 * fVar2 + fVar11 * fVar8;
    fVar7 = fVar17 * fVar11 + -fVar3 * fVar10 + fVar4 * fVar2 + fVar5 * fVar8;
    fVar8 = fVar5 * fVar3 + fVar11 * fVar4 + fVar2 * fVar9 + fVar10 * fVar8;
  }
  else {
    fVar6 = (float)*(undefined8 *)this;
    fVar7 = (float)((ulong)*(undefined8 *)this >> 0x20);
    fVar8 = (float)*(undefined8 *)(this + 8);
  }
  fVar2 = fVar8 * fVar8 + fVar6 * fVar6 + fVar7 * fVar7;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  uVar1 = -(uint)(0.7853982 < fVar2 * dt);
  fVar2 = (float)(~uVar1 & (uint)fVar2 | (uint)(0.7853982 / dt) & uVar1);
  if (0.001 <= fVar2) {
    fVar3 = sinf(fVar2 * 0.5 * dt);
    fVar3 = fVar3 / fVar2;
  }
  else {
    fVar3 = dt * 0.5 + dt * dt * dt * -0.020833334 * fVar2 * fVar2;
  }
  fVar8 = fVar8 * fVar3;
  fVar6 = fVar6 * fVar3;
  fVar7 = fVar7 * fVar3;
  if ((char)quat == '\0') {
    fVar5 = cosf(dt * fVar2 * 0.5);
    fVar2 = omega->m_floats[0];
    fVar3 = omega->m_floats[1];
    fVar4 = omega->m_floats[2];
    fVar9 = omega->m_floats[3];
    bVar12 = fVar2 * -fVar7 + fVar3 * fVar6 + fVar5 * fVar4 + fVar8 * fVar9;
    bVar13 = fVar3 * -fVar8 + fVar4 * fVar7 + fVar5 * fVar2 + fVar6 * fVar9;
    bVar14 = fVar4 * -fVar6 + fVar2 * fVar8 + fVar5 * fVar3 + fVar7 * fVar9;
    bVar15 = fVar4 * -fVar8 + fVar3 * -fVar7 + fVar5 * fVar9 + -fVar6 * fVar2;
  }
  else {
    fVar4 = cosf(dt * fVar2 * 0.5);
    fVar3 = omega->m_floats[3];
    fVar9 = (float)*(undefined8 *)(omega->m_floats + 1);
    fVar5 = (float)((ulong)*(undefined8 *)(omega->m_floats + 1) >> 0x20);
    fVar2 = omega->m_floats[0];
    bVar12 = fVar6 * fVar9 + -fVar7 * fVar2 + -fVar8 * fVar3 + fVar5 * fVar4;
    bVar13 = fVar7 * fVar5 + -fVar8 * fVar9 + -fVar6 * fVar3 + fVar2 * fVar4;
    bVar14 = fVar8 * fVar2 + -fVar6 * fVar5 + -fVar7 * fVar3 + fVar9 * fVar4;
    bVar15 = fVar8 * fVar5 + fVar7 * fVar9 + fVar4 * fVar3 + fVar2 * fVar6;
  }
  omega->m_floats[0] = bVar13;
  omega->m_floats[1] = bVar14;
  omega->m_floats[2] = bVar12;
  omega->m_floats[3] = bVar15;
  btQuaternion::normalize((btQuaternion *)omega);
  return;
}

Assistant:

void operator() (const btVector3 &omega, btQuaternion &quat, bool baseBody, btScalar dt)
		{
			//baseBody	=>	quat is alias and omega is global coor
			//!baseBody	=>	quat is alibi and omega is local coor	
			
			btVector3 axis;
			btVector3 angvel;

			if(!baseBody)			
				angvel = quatRotate(quat, omega);				//if quat is not m_baseQuat, it is alibi => ok			
			else
				angvel = omega;
		
			btScalar fAngle = angvel.length(); 		
			//limit the angular motion
			if (fAngle * dt > ANGULAR_MOTION_THRESHOLD)
			{
				fAngle = btScalar(0.5)*SIMD_HALF_PI / dt;
			}

			if ( fAngle < btScalar(0.001) )
			{
				// use Taylor's expansions of sync function
				axis   = angvel*( btScalar(0.5)*dt-(dt*dt*dt)*(btScalar(0.020833333333))*fAngle*fAngle );
			}
			else
			{
				// sync(fAngle) = sin(c*fAngle)/t
				axis   = angvel*( btSin(btScalar(0.5)*fAngle*dt)/fAngle );
			}
			
			if(!baseBody)				
				quat = btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat;			
			else			
				quat = quat * btQuaternion(-axis.x(),-axis.y(),-axis.z(),btCos( fAngle*dt*btScalar(0.5) ));
				//equivalent to: quat = (btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat.inverse()).inverse();			
		
			quat.normalize();
		}